

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

QString * __thiscall QCss::Value::toString(QString *__return_storage_ptr__,Value *this)

{
  char *pcVar1;
  int iVar2;
  storage_type *psVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  Data *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->type == KnownIdentifier) {
    iVar2 = ::QVariant::toInt((bool *)&this->variant);
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar3 + (ulong)""[iVar2] * 0x28 + 0x6c18c1;
      psVar3 = psVar3 + 1;
    } while (*pcVar1 != '\0');
    QVar4.m_data = psVar3;
    QVar4.m_size = (qsizetype)&local_38;
    QString::fromLatin1(QVar4);
    (__return_storage_ptr__->d).d = local_38;
    (__return_storage_ptr__->d).ptr = pcStack_30;
    (__return_storage_ptr__->d).size = local_28;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    ::QVariant::toString();
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString Value::toString() const
{
    if (type == KnownIdentifier) {
        return QLatin1StringView(values[indexOfId[variant.toInt()]].name);
    } else {
        return variant.toString();
    }
}